

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

NodeSequence __thiscall
GraphBuilder::insertPthreadMutexUnlock(GraphBuilder *this,CallInst *callInstruction)

{
  Function *pFVar1;
  CallInst *in_RDI;
  UnlockNode *unlockNode;
  UnlockNode *in_stack_00000040;
  GraphBuilder *in_stack_00000048;
  CallInst *in_stack_ffffffffffffffc8;
  CallBase *in_stack_ffffffffffffffd8;
  NodeSequence local_10;
  
  pFVar1 = llvm::CallBase::getCalledFunction(in_stack_ffffffffffffffd8);
  if (pFVar1 == (Function *)0x0) {
    createNode<(NodeType)4,decltype(nullptr),llvm::CallInst_const*>
              (in_RDI,in_stack_ffffffffffffffc8);
    addNode<UnlockNode>(in_stack_00000048,in_stack_00000040);
  }
  else {
    createNode<(NodeType)4,llvm::CallInst_const*>(in_RDI);
    addNode<UnlockNode>(in_stack_00000048,in_stack_00000040);
  }
  std::pair<Node_*,_Node_*>::pair<UnlockNode_*&,_UnlockNode_*&,_true>
            (&local_10,(UnlockNode **)&stack0xffffffffffffffd8,
             (UnlockNode **)&stack0xffffffffffffffd8);
  return local_10;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::insertPthreadMutexUnlock(const CallInst *callInstruction) {
    UnlockNode *unlockNode;
    if (callInstruction->getCalledFunction()) {
        unlockNode = addNode(createNode<NodeType::UNLOCK>(callInstruction));
    } else {
        unlockNode =
                addNode(createNode<NodeType::UNLOCK>(nullptr, callInstruction));
    }

    return {unlockNode, unlockNode};
}